

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *cctx,ZSTD_EndDirective endOp,size_t inSize)

{
  ZSTD_dictContentType_e dictContentType;
  void *dict;
  void *dict_00;
  void *pvVar1;
  unsigned_long_long uVar2;
  ZSTD_customMem customMem;
  ZSTD_compressionParameters cParams;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ZSTD_cParamMode_e mode;
  ZSTD_CDict *pZVar6;
  size_t sVar7;
  size_t sVar8;
  ZSTD_paramSwitch_e ZVar9;
  U64 pledgedSrcSize;
  bool bVar10;
  unsigned_long_long *local_140;
  ZSTD_compressionParameters local_128;
  ZSTD_CCtx_params local_100;
  
  memcpy(&local_100,&cctx->requestedParams,0xd0);
  dict = (cctx->localDict).dict;
  dict_00 = (cctx->prefixDict).dict;
  sVar8 = (cctx->prefixDict).dictSize;
  dictContentType = (cctx->prefixDict).dictContentType;
  if (dict == (void *)0x0) {
    if ((cctx->localDict).dictBuffer != (void *)0x0) {
      __assert_fail("dl->dictBuffer == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x4dc,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->localDict).cdict != (ZSTD_CDict *)0x0) {
      __assert_fail("dl->cdict == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x4dd,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if ((cctx->localDict).dictSize != 0) {
      __assert_fail("dl->dictSize == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x4de,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
LAB_0058b490:
    (cctx->prefixDict).dict = (void *)0x0;
    (cctx->prefixDict).dictSize = 0;
    *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
    pZVar6 = cctx->cdict;
    bVar10 = pZVar6 == (ZSTD_CDict *)0x0;
    if (dict_00 == (void *)0x0) {
      bVar3 = true;
      if (dict == (void *)0x0 && pZVar6 != (ZSTD_CDict *)0x0) {
        local_100.compressionLevel = pZVar6->compressionLevel;
        bVar10 = false;
      }
    }
    else {
      if (pZVar6 != (ZSTD_CDict *)0x0) {
        __assert_fail("prefixDict.dict==NULL || cctx->cdict==NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x17df,
                      "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)"
                     );
      }
      bVar10 = true;
      bVar3 = false;
      pZVar6 = (ZSTD_CDict *)0x0;
    }
  }
  else {
    pZVar6 = (cctx->localDict).cdict;
    if (pZVar6 != (ZSTD_CDict *)0x0) {
      if (cctx->cdict != pZVar6) {
        __assert_fail("cctx->cdict == dl->cdict",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x4e3,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
      }
      goto LAB_0058b490;
    }
    sVar7 = (cctx->localDict).dictSize;
    if (sVar7 == 0) {
      __assert_fail("dl->dictSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x4e6,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if (cctx->cdict != (ZSTD_CDict *)0x0) {
      __assert_fail("cctx->cdict == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x4e7,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    if (dict_00 != (void *)0x0) {
      __assert_fail("cctx->prefixDict.dict == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x4e8,"size_t ZSTD_initLocalDict(ZSTD_CCtx *)");
    }
    pvVar1 = (cctx->customMem).opaque;
    customMem.customFree._4_4_ = (int)((ulong)(cctx->customMem).customFree >> 0x20);
    customMem._0_12_ = *(undefined1 (*) [12])&cctx->customMem;
    customMem.opaque._0_4_ = (int)pvVar1;
    customMem.opaque._4_4_ = (int)((ulong)pvVar1 >> 0x20);
    pZVar6 = ZSTD_createCDict_advanced2
                       (dict,sVar7,ZSTD_dlm_byRef,(cctx->localDict).dictContentType,
                        &cctx->requestedParams,customMem);
    (cctx->localDict).cdict = pZVar6;
    if (pZVar6 == (ZSTD_CDict *)0x0) {
      return 0xffffffffffffffc0;
    }
    cctx->cdict = pZVar6;
    *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
    (cctx->prefixDict).dict = (void *)0x0;
    (cctx->prefixDict).dictSize = 0;
    bVar3 = true;
    bVar10 = false;
  }
  if (endOp == ZSTD_e_end) {
    cctx->pledgedSrcSizePlusOne = inSize + 1;
  }
  if (bVar3) {
    if (bVar10) {
      pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
      mode = ZSTD_cpm_noAttachDict;
      sVar7 = 0;
      goto LAB_0058b5f2;
    }
    pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
    sVar7 = pZVar6->dictContentSize;
  }
  else {
    pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
    mode = ZSTD_cpm_noAttachDict;
    sVar7 = sVar8;
    if (bVar10) goto LAB_0058b5f2;
  }
  mode = ZSTD_shouldAttachDict(pZVar6,&local_100,pledgedSrcSize);
LAB_0058b5f2:
  local_140 = &cctx->pledgedSrcSizePlusOne;
  ZSTD_getCParamsFromCCtxParams(&local_128,&local_100,pledgedSrcSize,sVar7,mode);
  local_100.cParams.targetLength = local_128.targetLength;
  local_100.cParams.strategy = local_128.strategy;
  uVar5 = local_100.cParams._20_8_;
  local_100.cParams.windowLog = local_128.windowLog;
  local_100.cParams.chainLog = local_128.chainLog;
  uVar4 = local_100.cParams._0_8_;
  local_100.cParams.strategy = local_128.strategy;
  local_100.cParams.windowLog = local_128.windowLog;
  if (local_100.useBlockSplitter == ZSTD_ps_auto) {
    if (local_100.cParams.strategy < ZSTD_btopt) {
      local_100.useBlockSplitter = ZSTD_ps_disable;
    }
    else {
      local_100.useBlockSplitter = (local_100.cParams.windowLog < 0x11) + ZSTD_ps_enable;
    }
  }
  if (local_100.ldmParams.enableLdm == ZSTD_ps_auto) {
    if (local_100.cParams.strategy < ZSTD_btopt) {
      local_100.ldmParams.enableLdm = ZSTD_ps_disable;
    }
    else {
      local_100.ldmParams.enableLdm = (local_100.cParams.windowLog < 0x1b) + ZSTD_ps_enable;
    }
  }
  if (local_100.useRowMatchFinder == ZSTD_ps_auto) {
    if (local_100.cParams.strategy - ZSTD_btlazy2 < 0xfffffffd) {
      local_100.useRowMatchFinder = ZSTD_ps_disable;
    }
    else {
      local_100.useRowMatchFinder = (local_100.cParams.windowLog < 0xf) + ZSTD_ps_enable;
    }
  }
  sVar7 = 0x20000;
  if (local_100.maxBlockSize != 0) {
    sVar7 = local_100.maxBlockSize;
  }
  ZVar9 = (local_100.compressionLevel < 10) + ZSTD_ps_enable;
  if (local_100.searchForExternalRepcodes != ZSTD_ps_auto) {
    ZVar9 = local_100.searchForExternalRepcodes;
  }
  uVar2 = *local_140;
  cParams.hashLog = local_128.hashLog;
  cParams.windowLog = local_128.windowLog;
  cParams.chainLog = local_128.chainLog;
  cParams.searchLog = local_128.searchLog;
  cParams.minMatch = local_128.minMatch;
  cParams.targetLength = local_128.targetLength;
  cParams.strategy = local_100.cParams.strategy;
  local_100.cParams._0_8_ = uVar4;
  local_100.cParams._20_8_ = uVar5;
  local_100.maxBlockSize = sVar7;
  local_100.searchForExternalRepcodes = ZVar9;
  sVar7 = ZSTD_checkCParams(cParams);
  if (sVar7 < 0xffffffffffffff89) {
    sVar8 = ZSTD_compressBegin_internal
                      (cctx,dict_00,sVar8,dictContentType,ZSTD_dtlm_fast,cctx->cdict,&local_100,
                       uVar2 - 1,ZSTDb_buffered);
    if (sVar8 < 0xffffffffffffff89) {
      if ((cctx->appliedParams).nbWorkers != 0) {
        __assert_fail("cctx->appliedParams.nbWorkers == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x1825,
                      "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)"
                     );
      }
      cctx->inToCompress = 0;
      cctx->inBuffPos = 0;
      if ((cctx->appliedParams).inBufferMode == ZSTD_bm_buffered) {
        sVar8 = (ulong)(cctx->blockSize == uVar2 - 1) + cctx->blockSize;
      }
      else {
        sVar8 = 0;
      }
      cctx->inBuffTarget = sVar8;
      cctx->outBuffContentSize = 0;
      cctx->outBuffFlushedSize = 0;
      cctx->streamStage = zcss_load;
      cctx->frameEnded = 0;
      sVar8 = 0;
    }
    return sVar8;
  }
  __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params.cParams))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x181f,
                "size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx *, ZSTD_EndDirective, size_t)");
}

Assistant:

static size_t ZSTD_CCtx_init_compressStream2(ZSTD_CCtx* cctx,
                                             ZSTD_EndDirective endOp,
                                             size_t inSize)
{
    ZSTD_CCtx_params params = cctx->requestedParams;
    ZSTD_prefixDict const prefixDict = cctx->prefixDict;
    FORWARD_IF_ERROR( ZSTD_initLocalDict(cctx) , ""); /* Init the local dict if present. */
    ZSTD_memset(&cctx->prefixDict, 0, sizeof(cctx->prefixDict));   /* single usage */
    assert(prefixDict.dict==NULL || cctx->cdict==NULL);    /* only one can be set */
    if (cctx->cdict && !cctx->localDict.cdict) {
        /* Let the cdict's compression level take priority over the requested params.
         * But do not take the cdict's compression level if the "cdict" is actually a localDict
         * generated from ZSTD_initLocalDict().
         */
        params.compressionLevel = cctx->cdict->compressionLevel;
    }
    DEBUGLOG(4, "ZSTD_compressStream2 : transparent init stage");
    if (endOp == ZSTD_e_end) cctx->pledgedSrcSizePlusOne = inSize + 1;  /* auto-determine pledgedSrcSize */

    {   size_t const dictSize = prefixDict.dict
                ? prefixDict.dictSize
                : (cctx->cdict ? cctx->cdict->dictContentSize : 0);
        ZSTD_cParamMode_e const mode = ZSTD_getCParamMode(cctx->cdict, &params, cctx->pledgedSrcSizePlusOne - 1);
        params.cParams = ZSTD_getCParamsFromCCtxParams(
                &params, cctx->pledgedSrcSizePlusOne-1,
                dictSize, mode);
    }

    params.useBlockSplitter = ZSTD_resolveBlockSplitterMode(params.useBlockSplitter, &params.cParams);
    params.ldmParams.enableLdm = ZSTD_resolveEnableLdm(params.ldmParams.enableLdm, &params.cParams);
    params.useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(params.useRowMatchFinder, &params.cParams);
    params.validateSequences = ZSTD_resolveExternalSequenceValidation(params.validateSequences);
    params.maxBlockSize = ZSTD_resolveMaxBlockSize(params.maxBlockSize);
    params.searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(params.searchForExternalRepcodes, params.compressionLevel);

#ifdef ZSTD_MULTITHREAD
    /* If external matchfinder is enabled, make sure to fail before checking job size (for consistency) */
    RETURN_ERROR_IF(
        params.useSequenceProducer == 1 && params.nbWorkers >= 1,
        parameter_combination_unsupported,
        "External sequence producer isn't supported with nbWorkers >= 1"
    );

    if ((cctx->pledgedSrcSizePlusOne-1) <= ZSTDMT_JOBSIZE_MIN) {
        params.nbWorkers = 0; /* do not invoke multi-threading when src size is too small */
    }
    if (params.nbWorkers > 0) {
#if ZSTD_TRACE
        cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
        /* mt context creation */
        if (cctx->mtctx == NULL) {
            DEBUGLOG(4, "ZSTD_compressStream2: creating new mtctx for nbWorkers=%u",
                        params.nbWorkers);
            cctx->mtctx = ZSTDMT_createCCtx_advanced((U32)params.nbWorkers, cctx->customMem, cctx->pool);
            RETURN_ERROR_IF(cctx->mtctx == NULL, memory_allocation, "NULL pointer!");
        }
        /* mt compression */
        DEBUGLOG(4, "call ZSTDMT_initCStream_internal as nbWorkers=%u", params.nbWorkers);
        FORWARD_IF_ERROR( ZSTDMT_initCStream_internal(
                    cctx->mtctx,
                    prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType,
                    cctx->cdict, params, cctx->pledgedSrcSizePlusOne-1) , "");
        cctx->dictID = cctx->cdict ? cctx->cdict->dictID : 0;
        cctx->dictContentSize = cctx->cdict ? cctx->cdict->dictContentSize : prefixDict.dictSize;
        cctx->consumedSrcSize = 0;
        cctx->producedCSize = 0;
        cctx->streamStage = zcss_load;
        cctx->appliedParams = params;
    } else
#endif  /* ZSTD_MULTITHREAD */
    {   U64 const pledgedSrcSize = cctx->pledgedSrcSizePlusOne - 1;
        assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
        FORWARD_IF_ERROR( ZSTD_compressBegin_internal(cctx,
                prefixDict.dict, prefixDict.dictSize, prefixDict.dictContentType, ZSTD_dtlm_fast,
                cctx->cdict,
                &params, pledgedSrcSize,
                ZSTDb_buffered) , "");
        assert(cctx->appliedParams.nbWorkers == 0);
        cctx->inToCompress = 0;
        cctx->inBuffPos = 0;
        if (cctx->appliedParams.inBufferMode == ZSTD_bm_buffered) {
            /* for small input: avoid automatic flush on reaching end of block, since
            * it would require to add a 3-bytes null block to end frame
            */
            cctx->inBuffTarget = cctx->blockSize + (cctx->blockSize == pledgedSrcSize);
        } else {
            cctx->inBuffTarget = 0;
        }
        cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
        cctx->streamStage = zcss_load;
        cctx->frameEnded = 0;
    }
    return 0;
}